

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefines.cpp
# Opt level: O0

bool soplex::msginconsistent(char *name,char *file,int line)

{
  ostream *poVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RSI);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"Inconsistency detected in ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool msginconsistent(const char* name, const char* file, int line)
{
   assert(name != nullptr);
   assert(file != nullptr);
   assert(line >= 0);

   SPX_MSG_ERROR(std::cerr << file << "(" << line << ") "
                 << "Inconsistency detected in " << name << std::endl;)

   return 0;
}